

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O1

string * anon_unknown.dwarf_5211b::getFuncName
                   (string *__return_storage_ptr__,string *name,size_t numArgs)

{
  ostream *poVar1;
  size_t sVar2;
  stringstream stream;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  if (numArgs != 0) {
    sVar2 = 0;
    do {
      if (sVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"x",1);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      sVar2 = sVar2 + 1;
    } while (numArgs != sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string getFuncName(std::string name, std::size_t numArgs) {
		std::stringstream stream;

		stream << name << "(";
		for (std::size_t i = 0; i < numArgs; i++) {
			if (i != 0) {
				stream << ", ";
			}

			stream << "x" << i;
		}

		stream << ")";

		return stream.str();
	}